

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O1

void __thiscall xray_re::xr_ibuf::xr_ibuf(xr_ibuf *this,xr_ibuf *that)

{
  size_t sVar1;
  uint16_t *__src;
  undefined7 uVar2;
  uint16_t *__dest;
  ulong uVar3;
  
  (this->super_xr_flexbuf)._vptr_xr_flexbuf = (_func_int **)&PTR__xr_flexbuf_00248830;
  uVar2 = *(undefined7 *)&(that->super_xr_flexbuf).field_0x9;
  sVar1 = (that->super_xr_flexbuf).m_size;
  (this->super_xr_flexbuf).m_owner = (that->super_xr_flexbuf).m_owner;
  *(undefined7 *)&(this->super_xr_flexbuf).field_0x9 = uVar2;
  (this->super_xr_flexbuf).m_size = sVar1;
  (this->super_xr_flexbuf)._vptr_xr_flexbuf = (_func_int **)&PTR__xr_ibuf_002487a8;
  (this->super_xr_flexbuf).m_owner = true;
  sVar1 = (that->super_xr_flexbuf).m_size;
  (this->super_xr_flexbuf).m_size = sVar1;
  __src = that->m_indices;
  if (__src == (uint16_t *)0x0) {
    __dest = (uint16_t *)0x0;
  }
  else {
    uVar3 = 0xffffffffffffffff;
    if (-1 < (long)sVar1) {
      uVar3 = sVar1 * 2;
    }
    __dest = (uint16_t *)operator_new__(uVar3);
    if (sVar1 != 0) {
      memcpy(__dest,__src,sVar1 * 2);
    }
  }
  this->m_indices = __dest;
  return;
}

Assistant:

xr_ibuf::xr_ibuf(const xr_ibuf& that): xr_flexbuf(that)
{
	set_owner(true);
	set_size(that.size());
	m_indices = duplicate(that.m_indices);
}